

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void fixstr(char *p)

{
  char *local_10;
  char *p_local;
  
  local_10 = p;
  if (p != (char *)0x0) {
    for (; *local_10 != '\0'; local_10 = local_10 + 1) {
      if (*local_10 == 'N') {
        *local_10 = '\n';
      }
      else if (*local_10 == 'T') {
        *local_10 = '\t';
      }
      else if (*local_10 == 'S') {
        *local_10 = ' ';
      }
      else if (*local_10 == 'Z') {
        *local_10 = '\0';
      }
    }
  }
  return;
}

Assistant:

void
fixstr(p)
register char *p;
{
	if (p == NULL)
		return;

	for (; *p != '\0'; p++)
		if (*p == 'N')
			*p = '\n';
		else if (*p == 'T')
			*p = '\t';
		else if (*p == 'S')
			*p = ' ';
		else if (*p == 'Z')
			*p = '\0';
}